

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O2

bool __thiscall QGenericItemModel::clearItemData(QGenericItemModel *this,QModelIndex *index)

{
  bool bVar1;
  
  bVar1 = QGenericItemModelImplBase::call<bool,QModelIndex>
                    (*(QGenericItemModelImplBase **)(this + 0x10),ClearItemData,index);
  return bVar1;
}

Assistant:

bool QGenericItemModel::clearItemData(const QModelIndex &index)
{
    return impl->call<bool>(QGenericItemModelImplBase::ClearItemData, index);
}